

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitRethrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Rethrow *curr)

{
  bool bVar1;
  uint uVar2;
  WasmException *pWVar3;
  WasmException *pWVar4;
  long lVar5;
  ulong uVar6;
  
  uVar2 = ((int)((ulong)((long)(this->exceptionStack).flexible.
                               super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->exceptionStack).flexible.
                              super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 +
          (int)(this->exceptionStack).usedFixed) - 1;
  if (-1 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
    pWVar4 = &(this->exceptionStack).fixed._M_elems[uVar6].first;
    lVar5 = uVar6 * 0x28 + -0xa0;
    do {
      pWVar3 = (WasmException *)
               ((long)&(((this->exceptionStack).flexible.
                         super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first).exn.field_0 + lVar5);
      if (uVar6 < 4) {
        pWVar3 = pWVar4;
      }
      if ((((Name *)(pWVar3 + 1))->super_IString).str._M_str ==
          (curr->target).super_IString.str._M_str) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[4])(this);
      }
      pWVar4 = (WasmException *)((long)(pWVar4 + -2) + 8);
      lVar5 = lVar5 + -0x28;
      bVar1 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar1);
  }
  handle_unreachable("rethrow",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x1149);
}

Assistant:

Flow visitRethrow(Rethrow* curr) {
    for (int i = exceptionStack.size() - 1; i >= 0; i--) {
      if (exceptionStack[i].second == curr->target) {
        throwException(exceptionStack[i].first);
      }
    }
    WASM_UNREACHABLE("rethrow");
  }